

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeAcquire(Rtree *pRtree,i64 iNode,RtreeNode *pParent,RtreeNode **ppNode)

{
  int iVar1;
  int iVar2;
  RtreeNode *pRVar3;
  undefined8 *in_RCX;
  RtreeNode *in_RDX;
  long in_RSI;
  long in_RDI;
  int unaff_retaddr;
  sqlite_int64 in_stack_00000008;
  char *in_stack_00000010;
  sqlite3_blob *pBlob;
  RtreeNode *pNode;
  sqlite3 *in_stack_00000028;
  int rc;
  sqlite3_blob **in_stack_000001f0;
  RtreeNode *in_stack_ffffffffffffffa8;
  Rtree *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Rtree *in_stack_ffffffffffffffc0;
  sqlite3_int64 iRow;
  int local_2c;
  int local_4;
  
  local_2c = 0;
  pRVar3 = nodeHashLookup(in_stack_ffffffffffffffc0,
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (pRVar3 == (RtreeNode *)0x0) {
    if (*(long *)(in_RDI + 0x70) != 0) {
      iRow = *(sqlite3_int64 *)(in_RDI + 0x70);
      *(undefined8 *)(in_RDI + 0x70) = 0;
      local_2c = sqlite3_blob_reopen((sqlite3_blob *)0x0,iRow);
      *(sqlite3_int64 *)(in_RDI + 0x70) = iRow;
      if ((local_2c != 0) && (nodeBlobReset(in_stack_ffffffffffffffb0), local_2c == 7)) {
        return 7;
      }
    }
    if (*(long *)(in_RDI + 0x70) == 0) {
      in_stack_ffffffffffffffa8 = (RtreeNode *)(in_RDI + 0x70);
      local_2c = sqlite3_blob_open(in_stack_00000028,(char *)pNode,(char *)pBlob,in_stack_00000010,
                                   in_stack_00000008,unaff_retaddr,in_stack_000001f0);
    }
    if (local_2c == 0) {
      iVar2 = *(int *)(in_RDI + 0x20);
      iVar1 = sqlite3_blob_bytes(*(sqlite3_blob **)(in_RDI + 0x70));
      if (iVar2 == iVar1) {
        pRVar3 = (RtreeNode *)sqlite3_malloc64((sqlite3_uint64)in_stack_ffffffffffffffa8);
        if (pRVar3 == (RtreeNode *)0x0) {
          local_2c = 7;
        }
        else {
          pRVar3->pParent = in_RDX;
          pRVar3->zData = (u8 *)(pRVar3 + 1);
          pRVar3->nRef = 1;
          *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + 1;
          pRVar3->iNode = in_RSI;
          pRVar3->isDirty = 0;
          pRVar3->pNext = (RtreeNode *)0x0;
          local_2c = sqlite3_blob_read((sqlite3_blob *)in_stack_ffffffffffffffb0,
                                       in_stack_ffffffffffffffa8,0,0x29a858);
        }
      }
    }
    else {
      *in_RCX = 0;
      if (local_2c == 1) {
        local_2c = 0x10b;
      }
    }
    if (((local_2c == 0) && (pRVar3 != (RtreeNode *)0x0)) && (in_RSI == 1)) {
      iVar2 = readInt16(pRVar3->zData);
      *(int *)(in_RDI + 0x2c) = iVar2;
      if (0x28 < *(int *)(in_RDI + 0x2c)) {
        local_2c = 0x10b;
      }
    }
    if (((pRVar3 != (RtreeNode *)0x0) && (local_2c == 0)) &&
       (iVar2 = readInt16(pRVar3->zData + 2),
       (*(int *)(in_RDI + 0x20) + -4) / (int)(uint)*(byte *)(in_RDI + 0x27) < iVar2)) {
      local_2c = 0x10b;
    }
    if (local_2c == 0) {
      if (pRVar3 == (RtreeNode *)0x0) {
        local_2c = 0x10b;
      }
      else {
        nodeReference(in_RDX);
        nodeHashInsert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      *in_RCX = pRVar3;
    }
    else {
      nodeBlobReset(in_stack_ffffffffffffffb0);
      if (pRVar3 != (RtreeNode *)0x0) {
        *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + -1;
        sqlite3_free((void *)0x29a95f);
      }
      *in_RCX = 0;
    }
    local_4 = local_2c;
  }
  else if ((in_RDX == (RtreeNode *)0x0) || (in_RDX == pRVar3->pParent)) {
    pRVar3->nRef = pRVar3->nRef + 1;
    *in_RCX = pRVar3;
    local_4 = 0;
  }
  else {
    local_4 = 0x10b;
  }
  return local_4;
}

Assistant:

static int nodeAcquire(
  Rtree *pRtree,             /* R-tree structure */
  i64 iNode,                 /* Node number to load */
  RtreeNode *pParent,        /* Either the parent node or NULL */
  RtreeNode **ppNode         /* OUT: Acquired node */
){
  int rc = SQLITE_OK;
  RtreeNode *pNode = 0;

  /* Check if the requested node is already in the hash table. If so,
  ** increase its reference count and return it.
  */
  if( (pNode = nodeHashLookup(pRtree, iNode))!=0 ){
    if( pParent && ALWAYS(pParent!=pNode->pParent) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    pNode->nRef++;
    *ppNode = pNode;
    return SQLITE_OK;
  }

  if( pRtree->pNodeBlob ){
    sqlite3_blob *pBlob = pRtree->pNodeBlob;
    pRtree->pNodeBlob = 0;
    rc = sqlite3_blob_reopen(pBlob, iNode);
    pRtree->pNodeBlob = pBlob;
    if( rc ){
      nodeBlobReset(pRtree);
      if( rc==SQLITE_NOMEM ) return SQLITE_NOMEM;
    }
  }
  if( pRtree->pNodeBlob==0 ){
    rc = sqlite3_blob_open(pRtree->db, pRtree->zDb, pRtree->zNodeName,
                           "data", iNode, 0,
                           &pRtree->pNodeBlob);
  }
  if( rc ){
    *ppNode = 0;
    /* If unable to open an sqlite3_blob on the desired row, that can only
    ** be because the shadow tables hold erroneous data. */
    if( rc==SQLITE_ERROR ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }else if( pRtree->iNodeSize==sqlite3_blob_bytes(pRtree->pNodeBlob) ){
    pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode)+pRtree->iNodeSize);
    if( !pNode ){
      rc = SQLITE_NOMEM;
    }else{
      pNode->pParent = pParent;
      pNode->zData = (u8 *)&pNode[1];
      pNode->nRef = 1;
      pRtree->nNodeRef++;
      pNode->iNode = iNode;
      pNode->isDirty = 0;
      pNode->pNext = 0;
      rc = sqlite3_blob_read(pRtree->pNodeBlob, pNode->zData,
                             pRtree->iNodeSize, 0);
    }
  }

  /* If the root node was just loaded, set pRtree->iDepth to the height
  ** of the r-tree structure. A height of zero means all data is stored on
  ** the root node. A height of one means the children of the root node
  ** are the leaves, and so on. If the depth as specified on the root node
  ** is greater than RTREE_MAX_DEPTH, the r-tree structure must be corrupt.
  */
  if( rc==SQLITE_OK && pNode && iNode==1 ){
    pRtree->iDepth = readInt16(pNode->zData);
    if( pRtree->iDepth>RTREE_MAX_DEPTH ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  /* If no error has occurred so far, check if the "number of entries"
  ** field on the node is too large. If so, set the return code to
  ** SQLITE_CORRUPT_VTAB.
  */
  if( pNode && rc==SQLITE_OK ){
    if( NCELL(pNode)>((pRtree->iNodeSize-4)/pRtree->nBytesPerCell) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  if( rc==SQLITE_OK ){
    if( pNode!=0 ){
      nodeReference(pParent);
      nodeHashInsert(pRtree, pNode);
    }else{
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
    *ppNode = pNode;
  }else{
    nodeBlobReset(pRtree);
    if( pNode ){
      pRtree->nNodeRef--;
      sqlite3_free(pNode);
    }
    *ppNode = 0;
  }

  return rc;
}